

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_console.cpp
# Opt level: O1

int __thiscall crnlib::console::vprintf(console *this,char *__format,__gnuc_va_list __arg)

{
  bool bVar1;
  bool bVar2;
  mutex *this_00;
  char cVar3;
  int extraout_EAX;
  size_t sVar4;
  char *pcVar5;
  uint i;
  ulong uVar6;
  int iVar7;
  char *pcVar8;
  long lVar9;
  dynamic_string tmp_buf;
  char buf [4096];
  dynamic_string local_1048;
  char local_1038 [4104];
  
  init((EVP_PKEY_CTX *)this);
  this_00 = m_pMutex;
  mutex::lock(m_pMutex);
  iVar7 = (int)this;
  *(int *)(m_num_messages + ((ulong)this & 0xffffffff) * 4) =
       *(int *)(m_num_messages + ((ulong)this & 0xffffffff) * 4) + 1;
  vsnprintf(local_1038,0x1000,__format,__arg);
  if (DAT_001df888 == 0) {
    bVar2 = false;
  }
  else {
    lVar9 = 8;
    uVar6 = 0;
    bVar2 = false;
    do {
      cVar3 = (**(code **)(m_output_funcs + -8 + lVar9))
                        ((ulong)this & 0xffffffff,local_1038,*(undefined8 *)(m_output_funcs + lVar9)
                        );
      if (cVar3 != '\0') {
        bVar2 = true;
      }
      uVar6 = uVar6 + 1;
      lVar9 = lVar9 + 0x10;
    } while (uVar6 < DAT_001df888);
  }
  bVar1 = true;
  if ((m_prefixes == '\x01') && (m_at_beginning_of_line == '\x01')) {
    if (iVar7 == 6) {
      pcVar8 = "Error: ";
    }
    else if (iVar7 == 5) {
      pcVar8 = "Warning: ";
    }
    else {
      if (iVar7 != 0) goto LAB_00111301;
      pcVar8 = "Debug: ";
    }
    bVar1 = false;
  }
  else {
LAB_00111301:
    pcVar8 = (char *)0x0;
  }
  if (!bVar2 && (m_output_disabled & 1) == 0) {
    if (!bVar1) {
      ::printf("%s",pcVar8);
    }
    pcVar8 = "%s";
    if (m_crlf != '\0') {
      pcVar8 = "%s\n";
    }
    ::printf(pcVar8,local_1038);
  }
  sVar4 = strlen(local_1038);
  m_at_beginning_of_line = true;
  if (m_crlf == '\0') {
    if ((int)sVar4 == 0) {
      m_at_beginning_of_line = false;
    }
    else {
      m_at_beginning_of_line = local_1038[(int)sVar4 - 1] == '\n';
    }
  }
  if ((iVar7 != 1) && (m_pLog_stream != (data_stream *)0x0)) {
    dynamic_string::dynamic_string(&local_1048,local_1038);
    dynamic_string::translate_lf_to_crlf(&local_1048);
    pcVar8 = "%s";
    if (m_crlf != '\0') {
      pcVar8 = "%s\r\n";
    }
    pcVar5 = "";
    if (local_1048.m_pStr != (char *)0x0) {
      pcVar5 = local_1048.m_pStr;
    }
    data_stream::printf(m_pLog_stream,pcVar8,pcVar5);
    (*m_pLog_stream->_vptr_data_stream[7])();
    if ((local_1048.m_pStr != (char *)0x0) &&
       ((*(uint *)(local_1048.m_pStr + -8) ^ *(uint *)(local_1048.m_pStr + -4)) == 0xffffffff)) {
      crnlib_free(local_1048.m_pStr + -0x10);
    }
  }
  mutex::unlock(this_00);
  return extraout_EAX;
}

Assistant:

void console::vprintf(eConsoleMessageType type, const char* p, va_list args) {
  init();

  scoped_mutex lock(*m_pMutex);

  m_num_messages[type]++;

  char buf[cConsoleBufSize];
  crnlib_vsnprintf(buf, cConsoleBufSize, p, args);

  bool handled = false;

  if (m_output_funcs.size()) {
    for (uint i = 0; i < m_output_funcs.size(); i++)
      if (m_output_funcs[i].m_func(type, buf, m_output_funcs[i].m_pData))
        handled = true;
  }

  const char* pPrefix = NULL;
  if ((m_prefixes) && (m_at_beginning_of_line)) {
    switch (type) {
      case cDebugConsoleMessage:
        pPrefix = "Debug: ";
        break;
      case cWarningConsoleMessage:
        pPrefix = "Warning: ";
        break;
      case cErrorConsoleMessage:
        pPrefix = "Error: ";
        break;
      default:
        break;
    }
  }

  if ((!m_output_disabled) && (!handled)) {
    if (pPrefix)
      ::printf("%s", pPrefix);
    ::printf(m_crlf ? "%s\n" : "%s", buf);
  }

  uint n = strlen(buf);
  m_at_beginning_of_line = (m_crlf) || ((n) && (buf[n - 1] == '\n'));

  if ((type != cProgressConsoleMessage) && (m_pLog_stream)) {
    // Yes this is bad.
    dynamic_string tmp_buf(buf);

    tmp_buf.translate_lf_to_crlf();

    m_pLog_stream->printf(m_crlf ? "%s\r\n" : "%s", tmp_buf.get_ptr());
    m_pLog_stream->flush();
  }
}